

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O2

bool __thiscall PruneReplayer::filter_object(PruneReplayer *this,ResourceTag tag,Hash hash)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this_00;
  Hash local_20;
  
  local_20 = hash;
  bVar3 = filter_timestamp(this,tag,hash,(uint64_t *)0x0);
  if (!bVar3) {
    return false;
  }
  bVar1 = (this->filter_graphics)._M_h._M_element_count == 0;
  bVar2 = (this->filter_compute)._M_h._M_element_count == 0;
  bVar3 = (this->filter_raytracing)._M_h._M_element_count == 0;
  if (tag == RESOURCE_GRAPHICS_PIPELINE) {
    sVar4 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->banned_graphics)._M_h,&local_20);
    if (sVar4 != 0) {
      return false;
    }
    if ((bVar1 && bVar2) && bVar3) goto LAB_00107d99;
    this_00 = &(this->filter_graphics)._M_h;
  }
  else if (tag == RESOURCE_RAYTRACING_PIPELINE) {
    sVar4 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->banned_raytracing)._M_h,&local_20);
    if (sVar4 != 0) {
      return false;
    }
    if ((bVar1 && bVar2) && bVar3) goto LAB_00107d99;
    this_00 = &(this->filter_raytracing)._M_h;
  }
  else {
    if (tag != RESOURCE_COMPUTE_PIPELINE) goto LAB_00107d99;
    sVar4 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->banned_compute)._M_h,&local_20);
    if (sVar4 != 0) {
      return false;
    }
    if ((bVar1 && bVar2) && bVar3) goto LAB_00107d99;
    this_00 = &(this->filter_compute)._M_h;
  }
  sVar4 = std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(this_00,&local_20);
  if (sVar4 == 0) {
    return false;
  }
LAB_00107d99:
  bVar3 = true;
  if ((this->blob_belongs_to_application_info == false) &&
     (this->should_filter_application_hash == true)) {
    sVar4 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&this->filtered_blob_hashes[tag]._M_h,&local_20);
    bVar3 = sVar4 != 0;
  }
  return bVar3;
}

Assistant:

bool filter_object(ResourceTag tag, Hash hash) const
	{
		if (!filter_timestamp(tag, hash, nullptr))
			return false;

		bool hash_filtering = !(filter_compute.empty() && filter_graphics.empty() && filter_raytracing.empty());
		if (tag == RESOURCE_COMPUTE_PIPELINE)
		{
			if (banned_compute.count(hash))
				return false;
			if (hash_filtering && !filter_compute.count(hash))
				return false;
		}
		else if (tag == RESOURCE_GRAPHICS_PIPELINE)
		{
			if (banned_graphics.count(hash))
				return false;
			if (hash_filtering && !filter_graphics.count(hash))
				return false;
		}
		else if (tag == RESOURCE_RAYTRACING_PIPELINE)
		{
			if (banned_raytracing.count(hash))
				return false;
			if (hash_filtering && !filter_raytracing.count(hash))
				return false;
		}

		return blob_belongs_to_application_info || !should_filter_application_hash || (filtered_blob_hashes[tag].count(hash) != 0);
	}